

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_dates(uchar **p,uchar *end,mbedtls_x509_time *from,mbedtls_x509_time *to)

{
  size_t local_40;
  size_t len;
  mbedtls_x509_time *pmStack_30;
  int ret;
  mbedtls_x509_time *to_local;
  mbedtls_x509_time *from_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  pmStack_30 = to;
  to_local = from;
  from_local = (mbedtls_x509_time *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_40,0x30);
  if (len._4_4_ == 0) {
    from_local = (mbedtls_x509_time *)(*(long *)end_local + local_40);
    len._4_4_ = mbedtls_x509_get_time((uchar **)end_local,(uchar *)from_local,to_local);
    p_local._4_4_ = len._4_4_;
    if ((len._4_4_ == 0) &&
       (len._4_4_ = mbedtls_x509_get_time((uchar **)end_local,(uchar *)from_local,pmStack_30),
       p_local._4_4_ = len._4_4_, len._4_4_ == 0)) {
      if (*(mbedtls_x509_time **)end_local == from_local) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ =
             mbedtls_error_add(-0x2400,-0x66,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                               ,0x1c6);
      }
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2400,len._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                           ,0x1b7);
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_dates(unsigned char **p,
                          const unsigned char *end,
                          mbedtls_x509_time *from,
                          mbedtls_x509_time *to)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE, ret);
    }

    end = *p + len;

    if ((ret = mbedtls_x509_get_time(p, end, from)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_x509_get_time(p, end, to)) != 0) {
        return ret;
    }

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}